

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkPhysicalDeviceRobustness2FeaturesEXT * __thiscall
Fossilize::StateRecorder::Impl::copy<VkPhysicalDeviceRobustness2FeaturesEXT>
          (Impl *this,VkPhysicalDeviceRobustness2FeaturesEXT *src,size_t count,
          ScratchAllocator *alloc)

{
  VkPhysicalDeviceRobustness2FeaturesEXT *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkPhysicalDeviceRobustness2FeaturesEXT>(alloc,count);
    if (pVVar1 != (VkPhysicalDeviceRobustness2FeaturesEXT *)0x0) {
      pVVar1 = (VkPhysicalDeviceRobustness2FeaturesEXT *)memmove(pVVar1,src,count << 5);
      return pVVar1;
    }
  }
  return (VkPhysicalDeviceRobustness2FeaturesEXT *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}